

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  cmGeneratedFileStream *pcVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  cmValue suffix;
  string *psVar7;
  string *obj;
  pointer pbVar8;
  string_view str;
  allocator<char> local_85;
  uint local_84;
  string *local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  pcVar1 = this->LocalGenerator;
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"_OBJECTS",&local_85);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_78,pcVar1,psVar5,&local_58);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  poVar6 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Object files for target ");
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,(string *)variableName);
  std::operator<<(poVar6," =");
  local_80 = (string *)&this->GlobalGenerator->LineContinueDirective;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_PCH_EXTENSION",(allocator<char> *)&local_58);
  local_38 = variableNameExternal;
  suffix = cmMakefile::GetDefinition(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  pbVar2 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_84 = (uint)useWatcomQuote;
  for (pbVar8 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    str._M_str = (pbVar8->_M_dataplus)._M_p;
    str._M_len = pbVar8->_M_string_length;
    bVar4 = cmHasSuffix(str,suffix);
    if (!bVar4) {
      poVar6 = std::operator<<((ostream *)
                               (this->BuildFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               " ");
      std::operator<<(poVar6,local_80);
      pcVar3 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_78,pbVar8,SUB41(local_84,0));
      std::operator<<((ostream *)pcVar3,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  std::operator<<((ostream *)
                  (this->BuildFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n");
  pcVar1 = this->LocalGenerator;
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"_EXTERNAL_OBJECTS",&local_85);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_78,pcVar1,psVar5,&local_58);
  psVar5 = local_38;
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  poVar6 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n")
  ;
  poVar6 = std::operator<<(poVar6,"# External object files for target ");
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar6 = std::operator<<(poVar6,(string *)psVar7);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  std::operator<<(poVar6," =");
  pbVar2 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl, pbVar8 != pbVar2
      ; pbVar8 = pbVar8 + 1) {
    poVar6 = std::operator<<((ostream *)pcVar3," ");
    std::operator<<(poVar6,local_80);
    pcVar3 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_78,pbVar8,SUB41(local_84,0));
    std::operator<<((ostream *)pcVar3,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  poVar6 = std::operator<<((ostream *)pcVar3,"\n");
  std::operator<<(poVar6,"\n");
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  const auto& lineContinue = this->GlobalGenerator->LineContinueDirective;

  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  for (std::string const& obj : this->ExternalObjects) {
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}